

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::GenericClassDefSymbol::SpecializationKey::SpecializationKey
          (SpecializationKey *this,GenericClassDefSymbol *def,
          span<const_slang::ConstantValue_*const,_18446744073709551615UL> paramValues,
          span<const_slang::ast::Type_*const,_18446744073709551615UL> typeParams)

{
  ConstantValue *this_00;
  Type *this_01;
  long lVar1;
  size_t sVar2;
  size_type sVar3;
  char *pcVar4;
  size_type sVar5;
  long lVar6;
  
  sVar5 = typeParams.size_;
  sVar3 = paramValues.size_;
  this->definition = def;
  (this->paramValues).data_ = paramValues.data_;
  (this->paramValues).size_ = sVar3;
  (this->typeParams).data_ = typeParams.data_;
  (this->typeParams).size_ = sVar5;
  pcVar4 = def[0x496038].paramDecls.stackBase + 0x69;
  if (sVar3 != 0) {
    lVar6 = 0;
    do {
      this_00 = *(ConstantValue **)((long)paramValues.data_ + lVar6);
      lVar1 = 0x9e3779b9;
      if (this_00 != (ConstantValue *)0x0) {
        sVar2 = ConstantValue::hash(this_00);
        lVar1 = sVar2 + 0x9e3779b9;
      }
      pcVar4 = (char *)(((ulong)pcVar4 >> 2) + (long)pcVar4 * 0x40 + lVar1 ^ (ulong)pcVar4);
      lVar6 = lVar6 + 8;
    } while (sVar3 << 3 != lVar6);
  }
  if (sVar5 != 0) {
    lVar6 = 0;
    do {
      this_01 = *(Type **)((long)typeParams.data_ + lVar6);
      lVar1 = 0x9e3779b9;
      if (this_01 != (Type *)0x0) {
        sVar2 = Type::hash(this_01);
        lVar1 = sVar2 + 0x9e3779b9;
      }
      pcVar4 = (char *)(((ulong)pcVar4 >> 2) + (long)pcVar4 * 0x40 + lVar1 ^ (ulong)pcVar4);
      lVar6 = lVar6 + 8;
    } while (sVar5 << 3 != lVar6);
  }
  this->savedHash = (size_t)pcVar4;
  return;
}

Assistant:

GenericClassDefSymbol::SpecializationKey::SpecializationKey(
    const GenericClassDefSymbol& def, span<const ConstantValue* const> paramValues,
    span<const Type* const> typeParams) :
    definition(&def),
    paramValues(paramValues), typeParams(typeParams) {

    // Precompute the hash.
    size_t h = 0;
    hash_combine(h, definition);
    for (auto val : paramValues)
        hash_combine(h, val ? val->hash() : 0);
    for (auto type : typeParams)
        hash_combine(h, type ? type->hash() : 0);
    savedHash = h;
}